

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

Vec_Ptr_t * Prs_CreateDetectRams(Prs_Ntk_t *pNtk)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int NameRamId;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *__s1;
  char *pcVar7;
  uint *puVar8;
  undefined8 *puVar9;
  void *pvVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  void **ppvVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  Vec_Ptr_t *local_68;
  int *local_48;
  
  NameRamId = Abc_NamStrFind(pNtk->pStrs,"Ram");
  if ((pNtk->vObjs).nSize < 1) {
    local_68 = (Vec_Ptr_t *)0x0;
  }
  else {
    lVar16 = 0;
    local_68 = (Vec_Ptr_t *)0x0;
    do {
      piVar12 = (pNtk->vObjs).pArray;
      iVar4 = piVar12[lVar16];
      if (((long)iVar4 < 0) || (uVar6 = (pNtk->vBoxes).nSize, (int)uVar6 <= iVar4)) {
LAB_003442d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = (pNtk->vBoxes).pArray;
      Prs_BoxSignals_V._0_4_ = piVar1[iVar4] + -2;
      iVar4 = piVar12[lVar16];
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      if (((long)iVar4 < -3) || (uVar6 <= iVar4 + 3U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Prs_BoxSignals_V._8_8_ = piVar1 + (iVar4 + 3U);
      if ((pNtk->vObjs).nSize <= lVar16) goto LAB_003442d8;
      if (*(int *)Prs_BoxSignals_V._8_8_ != 0) {
        if (iVar4 < -1) goto LAB_003442d8;
        __s1 = Abc_NamStr(pNtk->pStrs,piVar1[(long)iVar4 + 1]);
        iVar4 = strncmp(__s1,"ClockedWritePort_",0x11);
        if ((iVar4 == 0) || (iVar5 = strncmp(__s1,"ReadPort_",9), iVar5 == 0)) {
          pcVar7 = Prs_CreateDetectRamPort(pNtk,(Vec_Int_t *)Prs_BoxSignals_V,NameRamId);
          uVar3 = Prs_BoxSignals_V._8_8_;
          uVar2 = Prs_BoxSignals_V._4_4_;
          if (pcVar7 == (char *)0x0) {
            __assert_fail("pRamName",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                          ,0x6d6,"Vec_Ptr_t *Prs_CreateDetectRams(Prs_Ntk_t *)");
          }
          if (local_68 == (Vec_Ptr_t *)0x0) {
            local_68 = (Vec_Ptr_t *)malloc(0x10);
            local_48 = &local_68->nSize;
            local_68->nCap = 8;
            local_68->nSize = 0;
            ppvVar13 = (void **)malloc(0x40);
            local_68->pArray = ppvVar13;
          }
          else {
            local_48 = &local_68->nSize;
            uVar6 = local_68->nSize;
            if ((int)uVar6 < 1) {
              uVar17 = 0;
LAB_0034407e:
              if ((int)uVar17 < (int)uVar6) goto LAB_003442a8;
            }
            else {
              uVar17 = 0;
              do {
                puVar8 = (uint *)local_68->pArray[uVar17];
                if ((int)puVar8[1] < 1) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                if (pcVar7 == (char *)**(long **)(puVar8 + 2)) {
                  if (iVar4 == 0) {
                    lVar14 = (long)(int)Prs_BoxSignals_V._4_4_;
                    pVVar11 = (Vec_Int_t *)malloc(0x10);
                    pVVar11->nSize = uVar2;
                    pVVar11->nCap = uVar2;
                    if (lVar14 == 0) {
                      sVar15 = 0;
                      piVar12 = (int *)0x0;
                    }
                    else {
                      sVar15 = lVar14 << 2;
                      piVar12 = (int *)malloc(sVar15);
                    }
                    pVVar11->pArray = piVar12;
                    memcpy(piVar12,(void *)uVar3,sVar15);
                    Vec_IntPush(pVVar11,(int)lVar16);
                    uVar6 = puVar8[1];
                    if (uVar6 == *puVar8) {
                      if ((int)uVar6 < 0x10) {
                        if (*(void **)(puVar8 + 2) == (void *)0x0) {
                          pvVar10 = malloc(0x80);
                        }
                        else {
                          pvVar10 = realloc(*(void **)(puVar8 + 2),0x80);
                        }
                        *(void **)(puVar8 + 2) = pvVar10;
                        *puVar8 = 0x10;
                      }
                      else {
                        if (*(void **)(puVar8 + 2) == (void *)0x0) {
                          pvVar10 = malloc((ulong)uVar6 << 4);
                        }
                        else {
                          pvVar10 = realloc(*(void **)(puVar8 + 2),(ulong)uVar6 << 4);
                        }
                        *(void **)(puVar8 + 2) = pvVar10;
                        *puVar8 = uVar6 * 2;
                      }
                    }
                    else {
                      pvVar10 = *(void **)(puVar8 + 2);
                    }
                    uVar6 = puVar8[1];
                    puVar8[1] = uVar6 + 1;
                    *(Vec_Int_t **)((long)pvVar10 + (long)(int)uVar6 * 8) = pVVar11;
                    uVar6 = *local_48;
                  }
                  goto LAB_0034407e;
                }
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
            }
          }
          puVar8 = (uint *)malloc(0x10);
          *puVar8 = 8;
          puVar9 = (undefined8 *)malloc(0x40);
          *(undefined8 **)(puVar8 + 2) = puVar9;
          puVar8[1] = 1;
          *puVar9 = pcVar7;
          iVar5 = Prs_CreateGetMemSize(__s1);
          uVar6 = puVar8[1];
          if (uVar6 == *puVar8) {
            if ((int)uVar6 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar10 = malloc(0x80);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar8 + 2),0x80);
              }
              *(void **)(puVar8 + 2) = pvVar10;
              *puVar8 = 0x10;
            }
            else {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar10 = malloc((ulong)uVar6 << 4);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar8 + 2),(ulong)uVar6 << 4);
              }
              *(void **)(puVar8 + 2) = pvVar10;
              *puVar8 = uVar6 * 2;
            }
          }
          else {
            pvVar10 = *(void **)(puVar8 + 2);
          }
          uVar6 = puVar8[1];
          puVar8[1] = uVar6 + 1;
          *(long *)((long)pvVar10 + (long)(int)uVar6 * 8) = (long)iVar5;
          uVar3 = Prs_BoxSignals_V._8_8_;
          uVar2 = Prs_BoxSignals_V._4_4_;
          if (iVar4 == 0) {
            lVar14 = (long)(int)Prs_BoxSignals_V._4_4_;
            pVVar11 = (Vec_Int_t *)malloc(0x10);
            pVVar11->nSize = uVar2;
            pVVar11->nCap = uVar2;
            if (lVar14 == 0) {
              sVar15 = 0;
              piVar12 = (int *)0x0;
            }
            else {
              sVar15 = lVar14 << 2;
              piVar12 = (int *)malloc(sVar15);
            }
            pVVar11->pArray = piVar12;
            memcpy(piVar12,(void *)uVar3,sVar15);
            Vec_IntPush(pVVar11,(int)lVar16);
            uVar6 = puVar8[1];
            if (uVar6 == *puVar8) {
              if ((int)uVar6 < 0x10) {
                if (*(void **)(puVar8 + 2) == (void *)0x0) {
                  pvVar10 = malloc(0x80);
                }
                else {
                  pvVar10 = realloc(*(void **)(puVar8 + 2),0x80);
                }
                *(void **)(puVar8 + 2) = pvVar10;
                *puVar8 = 0x10;
              }
              else {
                if (*(void **)(puVar8 + 2) == (void *)0x0) {
                  pvVar10 = malloc((ulong)uVar6 << 4);
                }
                else {
                  pvVar10 = realloc(*(void **)(puVar8 + 2),(ulong)uVar6 << 4);
                }
                *(void **)(puVar8 + 2) = pvVar10;
                *puVar8 = uVar6 * 2;
              }
            }
            else {
              pvVar10 = *(void **)(puVar8 + 2);
            }
            uVar6 = puVar8[1];
            puVar8[1] = uVar6 + 1;
            *(Vec_Int_t **)((long)pvVar10 + (long)(int)uVar6 * 8) = pVVar11;
          }
          uVar6 = *local_48;
          if (uVar6 == local_68->nCap) {
            if ((int)uVar6 < 0x10) {
              if (local_68->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc(0x80);
              }
              else {
                ppvVar13 = (void **)realloc(local_68->pArray,0x80);
              }
              local_68->pArray = ppvVar13;
              local_68->nCap = 0x10;
            }
            else {
              if (local_68->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc((ulong)uVar6 << 4);
              }
              else {
                ppvVar13 = (void **)realloc(local_68->pArray,(ulong)uVar6 << 4);
              }
              local_68->pArray = ppvVar13;
              local_68->nCap = uVar6 * 2;
            }
          }
          else {
            ppvVar13 = local_68->pArray;
          }
          uVar6 = *local_48;
          *local_48 = uVar6 + 1;
          ppvVar13[(int)uVar6] = puVar8;
        }
      }
LAB_003442a8:
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pNtk->vObjs).nSize);
  }
  return local_68;
}

Assistant:

Vec_Ptr_t * Prs_CreateDetectRams( Prs_Ntk_t * pNtk )
{
    Vec_Ptr_t * vAllRams = NULL, * vRam; 
    Vec_Int_t * vBox, * vBoxCopy; 
    char * pNtkName, * pRamName;
    int NameRamId = Abc_NamStrFind( pNtk->pStrs, "Ram" );
    int i, k, fWrite;
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
            continue;
        pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
        fWrite = !strncmp(pNtkName, "ClockedWritePort_", strlen("ClockedWritePort_"));
        if ( fWrite || !strncmp(pNtkName, "ReadPort_", strlen("ReadPort_")) )
        {
            pRamName = Prs_CreateDetectRamPort( pNtk, vBox, NameRamId ); assert( pRamName );
            if ( vAllRams == NULL )
                vAllRams = Vec_PtrAlloc( 4 );
            Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, k )
                if ( pRamName == (char *)Vec_PtrEntry(vRam, 0) )
                {
                    if ( fWrite )
                    {
                        vBoxCopy = Vec_IntDup(vBox);
                        Vec_IntPush( vBoxCopy, i );
                        Vec_PtrPush( vRam, vBoxCopy );
                    }
                    break;
                }
            if ( k < Vec_PtrSize(vAllRams) )
                continue;
            vRam = Vec_PtrAlloc( 4 );
            Vec_PtrPush( vRam, pRamName );
            Vec_PtrPush( vRam, Abc_Int2Ptr(Prs_CreateGetMemSize(pNtkName)) );
            if ( fWrite )
            {
                vBoxCopy = Vec_IntDup(vBox);
                Vec_IntPush( vBoxCopy, i );
                Vec_PtrPush( vRam, vBoxCopy );
            }
            Vec_PtrPush( vAllRams, vRam );
        }
    }
    return vAllRams;
}